

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

void sprintf<unsigned_long>(stringstream *oss,string *fmt,unsigned_long value)

{
  ostream *poVar1;
  ostream *poVar2;
  byte bVar3;
  int iVar4;
  pointer pcVar5;
  long lVar6;
  char *__nptr;
  bool bVar7;
  ostream oVar8;
  runtime_error *prVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  bool bVar16;
  undefined1 auVar17 [12];
  char local_68;
  undefined7 uStack_67;
  long local_58 [2];
  char *local_48;
  char *local_40;
  unsigned_long local_38;
  
  bVar16 = fmt->_M_string_length != 0;
  local_38 = value;
  if (bVar16) {
    poVar1 = (ostream *)(oss + 0x10);
    uVar12 = 0;
    do {
      pcVar5 = (fmt->_M_dataplus)._M_p;
      uVar13 = uVar12;
      if ((pcVar5[uVar12] == '%') && (uVar13 = uVar12 + 1, pcVar5[uVar12 + 1] != '%')) {
        uVar12 = std::__cxx11::string::find_first_of((char *)fmt,0x12ed72,uVar13);
        if (uVar12 <= uVar13) {
          bVar7 = false;
          uVar14 = uVar13;
          goto LAB_0011781b;
        }
        bVar7 = false;
        goto LAB_00117743;
      }
      local_68 = pcVar5[uVar13];
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_68,1);
      uVar12 = uVar13 + 1;
      bVar16 = uVar12 < fmt->_M_string_length;
    } while (bVar16);
  }
  goto LAB_001176e2;
LAB_00117743:
  do {
    bVar3 = (fmt->_M_dataplus)._M_p[uVar13];
    uVar14 = uVar13;
    if (bVar3 < 0x2b) {
      if (bVar3 != 0x20) {
        if (bVar3 != 0x23) break;
        bVar7 = true;
      }
    }
    else if (bVar3 == 0x2b) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
    }
    else if (bVar3 == 0x2d) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
    }
    else {
      if (bVar3 != 0x30) break;
      if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
        poVar2 = poVar1 + *(long *)(*(long *)poVar1 + -0x18);
        if (oss[*(long *)(*(long *)poVar1 + -0x18) + 0xf1] == (stringstream)0x0) {
          oVar8 = (ostream)std::ios::widen((char)poVar2);
          poVar2[0xe0] = oVar8;
          poVar2[0xe1] = (ostream)0x1;
        }
        poVar2[0xe0] = (ostream)0x30;
      }
    }
    uVar13 = uVar13 + 1;
    uVar14 = uVar12;
  } while (uVar12 != uVar13);
LAB_0011781b:
  std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
  pcVar15 = (char *)CONCAT71(uStack_67,local_68);
  piVar10 = __errno_location();
  iVar4 = *piVar10;
  *piVar10 = 0;
  lVar11 = strtol(pcVar15,&local_48,10);
  local_40 = local_48;
  if (local_48 == pcVar15) {
    std::__throw_invalid_argument("stoi");
LAB_00117a83:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_00117a83;
    if (*piVar10 == 0) {
      *piVar10 = iVar4;
    }
    if ((long *)CONCAT71(uStack_67,local_68) != local_58) {
      operator_delete((long *)CONCAT71(uStack_67,local_68),local_58[0] + 1);
    }
    *(long *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x20) = (long)(int)lVar11;
    pcVar15 = local_40 + (uVar14 - (long)pcVar15);
    if (pcVar15[(long)(fmt->_M_dataplus)._M_p] != '.') {
LAB_001179ce:
      if ((byte)(pcVar15[(long)(fmt->_M_dataplus)._M_p] | 0x20U) == 0x78) {
        lVar11 = *(long *)(oss + 0x10);
        lVar6 = *(long *)(lVar11 + -0x18);
        *(uint *)(oss + lVar6 + 0x28) = *(uint *)(oss + lVar6 + 0x28) & 0xffffffb5 | 8;
        if (bVar7) {
          *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) =
               *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) | 0x200;
        }
      }
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
      sprintf((char *)oss,&local_68);
      if ((long *)CONCAT71(uStack_67,local_68) != local_58) {
        operator_delete((long *)CONCAT71(uStack_67,local_68),local_58[0] + 1);
      }
      if (bVar16) {
        return;
      }
LAB_001176e2:
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"extra arguments provided to sprintf");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
    __nptr = (char *)CONCAT71(uStack_67,local_68);
    piVar10 = __errno_location();
    iVar4 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol(__nptr,&local_48,10);
    if (local_48 != __nptr) {
      if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_00117a9b;
      if (*piVar10 == 0) {
        *piVar10 = iVar4;
      }
      if ((long *)CONCAT71(uStack_67,local_68) != local_58) {
        operator_delete((long *)CONCAT71(uStack_67,local_68),local_58[0] + 1);
      }
      *(long *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x18) = (long)(int)lVar11;
      pcVar15 = local_48 + (long)(pcVar15 + (1 - (long)__nptr));
      goto LAB_001179ce;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00117a9b:
  auVar17 = std::__throw_out_of_range("stoi");
  if (auVar17._8_4_ != 1) {
    _Unwind_Resume(auVar17._0_8_);
  }
  __cxa_begin_catch(auVar17._0_8_);
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"Expected precision value in sprintf");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}